

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_texture_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Instruction *i,bool sparse,bool *forward
          ,SmallVector<unsigned_int,_8UL> *inherited_expressions)

{
  size_t sVar1;
  uint *puVar2;
  SmallVector<unsigned_int,_8UL> *pSVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  MSLSamplerYCbCrModelConversion MVar7;
  MSLComponentSwizzle MVar8;
  uint32_t uVar9;
  uint32_t *puVar10;
  SPIRType *pSVar11;
  SPIRVariable *pSVar12;
  MSLConstexprSampler *pMVar13;
  long *plVar14;
  undefined8 *puVar15;
  runtime_error *prVar16;
  undefined7 in_register_00000009;
  long *plVar17;
  size_type *psVar18;
  ushort uVar19;
  char (*ts_2) [2];
  long lVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string inner_expr;
  string local_f0;
  char (*local_d0) [2];
  long *local_c8;
  ulong local_c0;
  long local_b8;
  long lStack_b0;
  SmallVector<unsigned_int,_8UL> *local_a8;
  uint local_9c;
  uint32_t local_98;
  undefined4 local_94;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  SPIRType *local_68;
  string local_60;
  SPIRType *local_40;
  ulong local_38;
  
  local_94 = (undefined4)CONCAT71(in_register_00000009,sparse);
  local_d0 = (char (*) [2])forward;
  local_a8 = inherited_expressions;
  puVar10 = Compiler::stream((Compiler *)this,i);
  local_38 = (ulong)*puVar10;
  uVar9 = puVar10[2];
  local_40 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + local_38);
  local_9c = (uint)i->op;
  uVar19 = i->op & 0xfffe;
  pSVar11 = Compiler::expression_type((Compiler *)this,uVar9);
  local_68 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr +
                        (pSVar11->super_IVariant).self.id);
  local_98 = uVar9;
  pSVar12 = Compiler::maybe_get_backing_variable((Compiler *)this,uVar9);
  if (pSVar12 == (SPIRVariable *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    bVar6 = true;
    pMVar13 = (MSLConstexprSampler *)0x0;
    bVar4 = false;
LAB_001dfe14:
    local_70 = &__return_storage_ptr__->field_2;
    if (((this->msl_options).swizzle_texture_samples == true && uVar19 != 0x60) &&
       (bVar5 = Compiler::is_sampled_image_type((Compiler *)this,local_68), bVar5 && bVar4 == false)
       ) {
      add_spv_func_and_recompile(this,SPVFuncImplTextureSwizzle);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_001dff1f;
    }
  }
  else {
    uVar9 = (pSVar12->basevariable).id;
    if (uVar9 == 0) {
      uVar9 = (pSVar12->super_IVariant).self.id;
    }
    pMVar13 = find_constexpr_sampler(this,uVar9);
    bVar4 = Compiler::has_extended_decoration
                      ((Compiler *)this,(pSVar12->super_IVariant).self.id,
                       SPIRVCrossDecorationDynamicImageSampler);
    local_70 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (pMVar13 == (MSLConstexprSampler *)0x0) {
      bVar6 = true;
      pMVar13 = (MSLConstexprSampler *)0x0;
      goto LAB_001dfe14;
    }
    if (bVar4 || pMVar13->ycbcr_conversion_enable != true) {
      bVar6 = false;
      goto LAB_001dfe14;
    }
    MVar7 = pMVar13->ycbcr_model;
    switch(MVar7) {
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
      goto switchD_001dfe86_caseD_0;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT709);
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT601);
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT2020);
      break;
    default:
      prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar16,"Invalid Y\'CbCr model conversion.");
      goto LAB_001e06ef;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    MVar7 = pMVar13->ycbcr_model;
switchD_001dfe86_caseD_0:
    if (MVar7 != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY) {
      if (pMVar13->ycbcr_range == MSL_SAMPLER_YCBCR_RANGE_ITU_NARROW) {
        add_spv_func_and_recompile(this,SPVFuncImplExpandITUNarrowRange);
      }
      else {
        if (pMVar13->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL) {
          prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error(prVar16,"Invalid Y\'CbCr range.");
LAB_001e06ef:
          *(undefined ***)prVar16 = &PTR__runtime_error_003a2f80;
          __cxa_throw(prVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        add_spv_func_and_recompile(this,SPVFuncImplExpandITUFullRange);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    bVar6 = false;
LAB_001dff1f:
    bVar4 = false;
  }
  ts_2 = local_d0;
  CompilerGLSL::to_texture_op_abi_cxx11_
            (&local_60,&this->super_CompilerGLSL,i,local_94._0_1_,(bool *)local_d0,local_a8);
  if ((bVar6) || (pMVar13->ycbcr_conversion_enable != true || bVar4 != false)) {
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
    if (((this->msl_options).swizzle_texture_samples == true && uVar19 != 0x60) &&
       (bVar6 = Compiler::is_sampled_image_type((Compiler *)this,local_68), bVar4 == false && bVar6)
       ) {
      to_swizzle_expression_abi_cxx11_(&local_90,this,local_98);
      plVar14 = (long *)::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x300ad6);
      plVar17 = plVar14 + 2;
      if ((long *)*plVar14 == plVar17) {
        local_b8 = *plVar17;
        lStack_b0 = plVar14[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *plVar17;
        local_c8 = (long *)*plVar14;
      }
      local_c0 = plVar14[1];
      *plVar14 = (long)plVar17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_c8);
      psVar18 = puVar15 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_f0.field_2._M_allocated_capacity = *psVar18;
        local_f0.field_2._8_8_ = puVar15[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar18;
        local_f0._M_dataplus._M_p = (pointer)*puVar15;
      }
      local_f0._M_string_length = puVar15[1];
      *puVar15 = psVar18;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      this->used_swizzle_buffer = true;
    }
    goto LAB_001e060f;
  }
  if ((pMVar13->swizzle[0] == MSL_COMPONENT_SWIZZLE_IDENTITY &&
      pMVar13->swizzle[1] == MSL_COMPONENT_SWIZZLE_IDENTITY) &&
      pMVar13->swizzle[2] == MSL_COMPONENT_SWIZZLE_IDENTITY) {
    MVar8 = pMVar13->swizzle[3];
    if (MVar8 != MSL_COMPONENT_SWIZZLE_IDENTITY) goto LAB_001e005a;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
  }
  else {
    if (pMVar13->swizzle[2] - MSL_COMPONENT_SWIZZLE_ZERO < 2 ||
        (pMVar13->swizzle[1] - MSL_COMPONENT_SWIZZLE_ZERO < 2 ||
        pMVar13->swizzle[0] - MSL_COMPONENT_SWIZZLE_ZERO < 2)) goto LAB_001e0065;
    MVar8 = pMVar13->swizzle[3];
LAB_001e005a:
    if (MVar8 - MSL_COMPONENT_SWIZZLE_ZERO < 2) {
LAB_001e0065:
      uVar9 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      local_d0 = (char (*) [2])CONCAT44(local_d0._4_4_,uVar9);
      ts_2 = (char (*) [2])0x0;
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,(uint32_t)local_38,uVar9,&local_60,false,false);
      sVar1 = (local_a8->super_VectorView<unsigned_int>).buffer_size;
      if (sVar1 != 0) {
        puVar2 = (local_a8->super_VectorView<unsigned_int>).ptr;
        lVar20 = 0;
        do {
          Compiler::inherit_expression_dependencies
                    ((Compiler *)this,(uint32_t)local_d0,*(uint32_t *)((long)puVar2 + lVar20));
          lVar20 = lVar20 + 4;
        } while (sVar1 << 2 != lVar20);
      }
      pSVar3 = local_a8;
      (local_a8->super_VectorView<unsigned_int>).buffer_size = 0;
      SmallVector<unsigned_int,_8UL>::reserve(local_a8,1);
      sVar1 = (pSVar3->super_VectorView<unsigned_int>).buffer_size;
      (pSVar3->super_VectorView<unsigned_int>).ptr[sVar1] = (uint32_t)local_d0;
      (pSVar3->super_VectorView<unsigned_int>).buffer_size = sVar1 + 1;
      if ((local_9c - 0x57 < 7) && ((0x55U >> (local_9c - 0x57 & 0x1f) & 1) != 0)) {
        CompilerGLSL::register_control_dependent_expression
                  (&this->super_CompilerGLSL,(uint32_t)local_d0);
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_c8,this,local_40,0);
      plVar14 = (long *)::std::__cxx11::string::append((char *)&local_c8);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      psVar18 = (size_type *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_f0.field_2._M_allocated_capacity = *psVar18;
        local_f0.field_2._8_8_ = plVar14[3];
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar18;
        local_f0._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_f0._M_string_length = plVar14[1];
      *plVar14 = (long)psVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8);
      }
      lVar20 = 0;
      do {
        switch(pMVar13->swizzle[lVar20]) {
        case MSL_COMPONENT_SWIZZLE_IDENTITY:
          CompilerGLSL::to_expression_abi_cxx11_
                    (&local_90,&this->super_CompilerGLSL,(uint32_t)local_d0,true);
          puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_90);
          local_c8 = &local_b8;
          plVar14 = puVar15 + 2;
          if ((long *)*puVar15 == plVar14) {
            local_b8 = *plVar14;
            lStack_b0 = puVar15[3];
          }
          else {
            local_b8 = *plVar14;
            local_c8 = (long *)*puVar15;
          }
          local_c0 = puVar15[1];
          *puVar15 = plVar14;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          ts_2 = (char (*) [2])(ulong)(uint)(int)"rgba"[lVar20];
          puVar15 = (undefined8 *)
                    ::std::__cxx11::string::_M_replace_aux((ulong)&local_c8,local_c0,0,'\x01');
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          psVar18 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_f0.field_2._M_allocated_capacity = *psVar18;
            local_f0.field_2._8_8_ = puVar15[3];
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar18;
            local_f0._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_f0._M_string_length = puVar15[1];
          *puVar15 = psVar18;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
          break;
        case MSL_COMPONENT_SWIZZLE_ZERO:
        case MSL_COMPONENT_SWIZZLE_ONE:
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          goto LAB_001e0492;
        case MSL_COMPONENT_SWIZZLE_R:
        case MSL_COMPONENT_SWIZZLE_G:
        case MSL_COMPONENT_SWIZZLE_B:
        case MSL_COMPONENT_SWIZZLE_A:
          CompilerGLSL::to_expression_abi_cxx11_
                    (&local_90,&this->super_CompilerGLSL,(uint32_t)local_d0,true);
          puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_90);
          local_c8 = &local_b8;
          plVar14 = puVar15 + 2;
          if ((long *)*puVar15 == plVar14) {
            local_b8 = *plVar14;
            lStack_b0 = puVar15[3];
          }
          else {
            local_b8 = *plVar14;
            local_c8 = (long *)*puVar15;
          }
          local_c0 = puVar15[1];
          *puVar15 = plVar14;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          ts_2 = (char (*) [2])
                 (ulong)(uint)(int)"spvTextureSwizzle("[(long)(int)pMVar13->swizzle[lVar20] + 0x10];
          puVar15 = (undefined8 *)
                    ::std::__cxx11::string::_M_replace_aux((ulong)&local_c8,local_c0,0,'\x01');
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          psVar18 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_f0.field_2._M_allocated_capacity = *psVar18;
            local_f0.field_2._8_8_ = puVar15[3];
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar18;
            local_f0._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_f0._M_string_length = puVar15[1];
          *puVar15 = psVar18;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
          break;
        default:
          prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error(prVar16,"Invalid component swizzle.");
          *(undefined ***)prVar16 = &PTR__runtime_error_003a2f80;
          __cxa_throw(prVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
LAB_001e0492:
        if (lVar20 == 3) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          goto LAB_001e05af;
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        lVar20 = lVar20 + 1;
      } while( true );
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_60._M_dataplus._M_p,
               local_60._M_dataplus._M_p + local_60._M_string_length);
    ::std::__cxx11::string::append((char *)&local_f0);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    lVar20 = 0;
    do {
      if ((3 < pMVar13->swizzle[lVar20] - MSL_COMPONENT_SWIZZLE_R) &&
         (pMVar13->swizzle[lVar20] != MSL_COMPONENT_SWIZZLE_IDENTITY)) {
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(prVar16,"Invalid component swizzle.");
        *(undefined ***)prVar16 = &PTR__runtime_error_003a2f80;
        __cxa_throw(prVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
  }
LAB_001e05af:
  if (pMVar13->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY) {
    join<char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
              (&local_f0,(spirv_cross *)0x300ad6,(char (*) [3])&pMVar13->bpc,(uint *)0x30f9b8,ts_2);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (pMVar13->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
LAB_001e060f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_texture_op(const Instruction &i, bool sparse, bool *forward,
                                  SmallVector<uint32_t> &inherited_expressions)
{
	auto *ops = stream(i);
	uint32_t result_type_id = ops[0];
	uint32_t img = ops[2];
	auto &result_type = get<SPIRType>(result_type_id);
	auto op = static_cast<Op>(i.op);
	bool is_gather = (op == OpImageGather || op == OpImageDrefGather);

	// Bypass pointers because we need the real image struct
	auto &type = expression_type(img);
	auto &imgtype = get<SPIRType>(type.self);

	const MSLConstexprSampler *constexpr_sampler = nullptr;
	bool is_dynamic_img_sampler = false;
	if (auto *var = maybe_get_backing_variable(img))
	{
		constexpr_sampler = find_constexpr_sampler(var->basevariable ? var->basevariable : VariableID(var->self));
		is_dynamic_img_sampler = has_extended_decoration(var->self, SPIRVCrossDecorationDynamicImageSampler);
	}

	string expr;
	if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable && !is_dynamic_img_sampler)
	{
		// If this needs sampler Y'CbCr conversion, we need to do some additional
		// processing.
		switch (constexpr_sampler->ycbcr_model)
		{
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
			// Default
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT709);
			expr += "spvConvertYCbCrBT709(";
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT601);
			expr += "spvConvertYCbCrBT601(";
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT2020);
			expr += "spvConvertYCbCrBT2020(";
			break;
		default:
			SPIRV_CROSS_THROW("Invalid Y'CbCr model conversion.");
		}

		if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY)
		{
			switch (constexpr_sampler->ycbcr_range)
			{
			case MSL_SAMPLER_YCBCR_RANGE_ITU_FULL:
				add_spv_func_and_recompile(SPVFuncImplExpandITUFullRange);
				expr += "spvExpandITUFullRange(";
				break;
			case MSL_SAMPLER_YCBCR_RANGE_ITU_NARROW:
				add_spv_func_and_recompile(SPVFuncImplExpandITUNarrowRange);
				expr += "spvExpandITUNarrowRange(";
				break;
			default:
				SPIRV_CROSS_THROW("Invalid Y'CbCr range.");
			}
		}
	}
	else if (msl_options.swizzle_texture_samples && !is_gather && is_sampled_image_type(imgtype) &&
	         !is_dynamic_img_sampler)
	{
		add_spv_func_and_recompile(SPVFuncImplTextureSwizzle);
		expr += "spvTextureSwizzle(";
	}

	string inner_expr = CompilerGLSL::to_texture_op(i, sparse, forward, inherited_expressions);

	if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable && !is_dynamic_img_sampler)
	{
		if (!constexpr_sampler->swizzle_is_identity())
		{
			static const char swizzle_names[] = "rgba";
			if (!constexpr_sampler->swizzle_has_one_or_zero())
			{
				// If we can, do it inline.
				expr += inner_expr + ".";
				for (uint32_t c = 0; c < 4; c++)
				{
					switch (constexpr_sampler->swizzle[c])
					{
					case MSL_COMPONENT_SWIZZLE_IDENTITY:
						expr += swizzle_names[c];
						break;
					case MSL_COMPONENT_SWIZZLE_R:
					case MSL_COMPONENT_SWIZZLE_G:
					case MSL_COMPONENT_SWIZZLE_B:
					case MSL_COMPONENT_SWIZZLE_A:
						expr += swizzle_names[constexpr_sampler->swizzle[c] - MSL_COMPONENT_SWIZZLE_R];
						break;
					default:
						SPIRV_CROSS_THROW("Invalid component swizzle.");
					}
				}
			}
			else
			{
				// Otherwise, we need to emit a temporary and swizzle that.
				uint32_t temp_id = ir.increase_bound_by(1);
				emit_op(result_type_id, temp_id, inner_expr, false);
				for (auto &inherit : inherited_expressions)
					inherit_expression_dependencies(temp_id, inherit);
				inherited_expressions.clear();
				inherited_expressions.push_back(temp_id);

				switch (op)
				{
				case OpImageSampleDrefImplicitLod:
				case OpImageSampleImplicitLod:
				case OpImageSampleProjImplicitLod:
				case OpImageSampleProjDrefImplicitLod:
					register_control_dependent_expression(temp_id);
					break;

				default:
					break;
				}
				expr += type_to_glsl(result_type) + "(";
				for (uint32_t c = 0; c < 4; c++)
				{
					switch (constexpr_sampler->swizzle[c])
					{
					case MSL_COMPONENT_SWIZZLE_IDENTITY:
						expr += to_expression(temp_id) + "." + swizzle_names[c];
						break;
					case MSL_COMPONENT_SWIZZLE_ZERO:
						expr += "0";
						break;
					case MSL_COMPONENT_SWIZZLE_ONE:
						expr += "1";
						break;
					case MSL_COMPONENT_SWIZZLE_R:
					case MSL_COMPONENT_SWIZZLE_G:
					case MSL_COMPONENT_SWIZZLE_B:
					case MSL_COMPONENT_SWIZZLE_A:
						expr += to_expression(temp_id) + "." +
						        swizzle_names[constexpr_sampler->swizzle[c] - MSL_COMPONENT_SWIZZLE_R];
						break;
					default:
						SPIRV_CROSS_THROW("Invalid component swizzle.");
					}
					if (c < 3)
						expr += ", ";
				}
				expr += ")";
			}
		}
		else
			expr += inner_expr;
		if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY)
		{
			expr += join(", ", constexpr_sampler->bpc, ")");
			if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY)
				expr += ")";
		}
	}
	else
	{
		expr += inner_expr;
		if (msl_options.swizzle_texture_samples && !is_gather && is_sampled_image_type(imgtype) &&
		    !is_dynamic_img_sampler)
		{
			// Add the swizzle constant from the swizzle buffer.
			expr += ", " + to_swizzle_expression(img) + ")";
			used_swizzle_buffer = true;
		}
	}

	return expr;
}